

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> __thiscall
kj::anon_unknown_30::SocketAddress::lookupHost
          (SocketAddress *this,LowLevelAsyncIoProvider *lowLevel,String *host,String *service,
          uint portHint,NetworkFilter *filter)

{
  Thread *pTVar1;
  ArrayDisposer *pAVar2;
  NetworkFilter *pNVar3;
  _func_int **pp_Var4;
  ArrayDisposer *pAVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  Thread *this_00;
  Disposer *pDVar9;
  AttachmentPromiseNodeBase *this_01;
  undefined4 extraout_var;
  undefined8 *__nbytes;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar10;
  LookupReader *ptrCopy;
  Own<kj::_::PromiseNode> OVar11;
  Thread *ptrCopy_2;
  Own<kj::AsyncInputStream> input;
  int fds [2];
  Fault f;
  Disposer local_e8;
  _func_int **pp_Stack_e0;
  Function<void_()> local_d0;
  uint local_c0;
  undefined4 local_bc;
  undefined1 local_b8 [40];
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  Fault local_68 [7];
  
  local_70 = filter;
  do {
    iVar8 = ::pipe2((int *)&local_c0,0x80800);
    if (-1 < iVar8) goto LAB_0031d4f4;
    iVar8 = _::Debug::getOsErrorNumber(false);
  } while (iVar8 == -1);
  if (iVar8 != 0) {
    local_68[0].exception = (Exception *)0x0;
    local_b8._0_8_ = (Disposer *)0x0;
    local_b8._8_8_ = (Thread *)0x0;
    _::Debug::Fault::init
              (local_68,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    _::Debug::Fault::fatal(local_68);
  }
LAB_0031d4f4:
  local_80 = this;
  (**lowLevel->_vptr_LowLevelAsyncIoProvider)(&local_e8,lowLevel,(ulong)local_c0,7);
  pTVar1 = (Thread *)(host->content).ptr;
  local_b8._16_8_ = (host->content).size_;
  pAVar2 = (host->content).disposer;
  (host->content).ptr = (char *)0x0;
  (host->content).size_ = 0;
  pNVar3 = (NetworkFilter *)(service->content).ptr;
  pp_Var4 = (_func_int **)(service->content).size_;
  pAVar5 = (service->content).disposer;
  (service->content).ptr = (char *)0x0;
  (service->content).size_ = 0;
  local_68[0].exception = (Exception *)0x0;
  local_68[1].exception = (Exception *)0x0;
  local_68[3].exception = (Exception *)0x0;
  local_68[4].exception = (Exception *)0x0;
  local_b8._0_8_ = (Disposer *)CONCAT44(portHint,local_bc);
  local_b8._8_8_ = pTVar1;
  local_b8._24_8_ = pAVar2;
  local_b8._32_8_ = pNVar3;
  uStack_90 = pp_Var4;
  local_88 = pAVar5;
  local_78 = local_b8._16_8_;
  local_68[2].exception = (Exception *)pAVar2;
  local_68[5].exception = (Exception *)pAVar5;
  this_00 = (Thread *)operator_new(0x18);
  local_d0.impl.ptr = (Iface *)operator_new(0x40);
  (local_d0.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0044c988;
  local_d0.impl.ptr[1]._vptr_Iface = (_func_int **)CONCAT44(portHint,local_bc);
  local_d0.impl.ptr[2]._vptr_Iface = (_func_int **)pTVar1;
  local_d0.impl.ptr[3]._vptr_Iface = (_func_int **)local_78;
  local_d0.impl.ptr[4]._vptr_Iface = (_func_int **)pAVar2;
  local_b8._8_8_ = (Thread *)0x0;
  local_b8._16_8_ = (Disposer *)0x0;
  local_d0.impl.ptr[5]._vptr_Iface = (_func_int **)pNVar3;
  local_d0.impl.ptr[6]._vptr_Iface = pp_Var4;
  local_d0.impl.ptr[7]._vptr_Iface = (_func_int **)pAVar5;
  local_b8._32_8_ = (NetworkFilter *)0x0;
  uStack_90._0_4_ = 0;
  uStack_90._4_1_ = false;
  uStack_90._5_3_ = 0;
  __nbytes = &_::
              HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
              ::instance;
  local_d0.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
        ::instance;
  Thread::Thread(this_00,&local_d0);
  if (local_d0.impl.ptr != (Iface *)0x0) {
    local_d0.impl.ptr = (Iface *)0x0;
    (**(local_d0.impl.disposer)->_vptr_Disposer)();
  }
  pDVar9 = (Disposer *)operator_new(0x100);
  pDVar9->_vptr_Disposer = (_func_int **)&_::HeapDisposer<kj::Thread>::instance;
  pDVar9[1]._vptr_Disposer = (_func_int **)this_00;
  pDVar9[2]._vptr_Disposer = local_e8._vptr_Disposer;
  pDVar9[3]._vptr_Disposer = pp_Stack_e0;
  pp_Stack_e0 = (_func_int **)0x0;
  pDVar9[4]._vptr_Disposer = (_func_int **)local_70;
  *(undefined4 *)&pDVar9[0x1b]._vptr_Disposer = 0;
  pDVar9[0x1c]._vptr_Disposer = (_func_int **)0x0;
  memset(pDVar9 + 5,0,0xa0);
  pDVar9[0x1d]._vptr_Disposer = (_func_int **)(pDVar9 + 0x1b);
  pDVar9[0x1e]._vptr_Disposer = (_func_int **)(pDVar9 + 0x1b);
  pDVar9[0x1f]._vptr_Disposer = (_func_int **)0x0;
  LookupReader::read((LookupReader *)local_b8,(int)pDVar9,__buf,(size_t)__nbytes);
  this_01 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  uVar7 = local_80;
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)local_b8);
  uVar6 = local_b8._8_8_;
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0044cab0;
  this_01[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader>::instance;
  this_01[1].dependency.disposer = pDVar9;
  pDVar9 = (Disposer *)
           &_::
            HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
            ::instance;
  *(undefined8 **)uVar7 =
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)(uVar7 + 8) = this_01;
  pPVar10 = extraout_RDX;
  if ((Thread *)local_b8._8_8_ != (Thread *)0x0) {
    local_b8._8_8_ = (Thread *)0x0;
    iVar8 = (***(_func_int ***)local_b8._0_8_)
                      (local_b8._0_8_,
                       (long)(ThreadState **)uVar6 +
                       *(long *)((long)&(*(ThreadState **)uVar6)[-1].exception.ptr.field_1 + 0x150))
    ;
    pDVar9 = (Disposer *)CONCAT44(extraout_var,iVar8);
    pPVar10 = extraout_RDX_00;
  }
  pp_Var4 = pp_Stack_e0;
  OVar11.ptr = pPVar10;
  OVar11.disposer = pDVar9;
  if (pp_Stack_e0 != (_func_int **)0x0) {
    pp_Stack_e0 = (_func_int **)0x0;
    OVar11 = (Own<kj::_::PromiseNode>)
             (**(code **)*local_e8._vptr_Disposer)
                       (local_e8._vptr_Disposer,(long)pp_Var4 + *(long *)((long)*pp_Var4 + -0x10));
  }
  return (PromiseBase)(PromiseBase)OVar11;
}

Assistant:

Promise<Array<SocketAddress>> SocketAddress::lookupHost(
    LowLevelAsyncIoProvider& lowLevel, kj::String host, kj::String service, uint portHint,
    _::NetworkFilter& filter) {
  // This shitty function spawns a thread to run getaddrinfo().  Unfortunately, getaddrinfo() is
  // the only cross-platform DNS API and it is blocking.
  //
  // TODO(perf):  Use a thread pool?  Maybe kj::Thread should use a thread pool automatically?
  //   Maybe use the various platform-specific asynchronous DNS libraries?  Please do not implement
  //   a custom DNS resolver...

  int fds[2];
#if __linux__ && !__BIONIC__
  KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
  KJ_SYSCALL(pipe(fds));
#endif

  auto input = lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS);

  int outFd = fds[1];

  LookupParams params = { kj::mv(host), kj::mv(service) };

  auto thread = heap<Thread>(kj::mvCapture(params, [outFd,portHint](LookupParams&& params) {
    FdOutputStream output((AutoCloseFd(outFd)));

    struct addrinfo* list;
    int status = getaddrinfo(
        params.host == "*" ? nullptr : params.host.cStr(),
        params.service == nullptr ? nullptr : params.service.cStr(),
        nullptr, &list);
    if (status == 0) {
      KJ_DEFER(freeaddrinfo(list));

      struct addrinfo* cur = list;
      while (cur != nullptr) {
        if (params.service == nullptr) {
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              ((struct sockaddr_in*)cur->ai_addr)->sin_port = htons(portHint);
              break;
            case AF_INET6:
              ((struct sockaddr_in6*)cur->ai_addr)->sin6_port = htons(portHint);
              break;
            default:
              break;
          }
        }

        SocketAddress addr;
        if (params.host == "*") {
          // Set up a wildcard SocketAddress.  Only use the port number returned by getaddrinfo().
          addr.wildcard = true;
          addr.addrlen = sizeof(addr.addr.inet6);
          addr.addr.inet6.sin6_family = AF_INET6;
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in*)cur->ai_addr)->sin_port;
              break;
            case AF_INET6:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in6*)cur->ai_addr)->sin6_port;
              break;
            default:
              addr.addr.inet6.sin6_port = portHint;
              break;
          }
        } else {
          addr.addrlen = cur->ai_addrlen;
          memcpy(&addr.addr.generic, cur->ai_addr, cur->ai_addrlen);
        }
        KJ_ASSERT_CAN_MEMCPY(SocketAddress);
        output.write(&addr, sizeof(addr));
        cur = cur->ai_next;
      }
    } else if (status == EAI_SYSTEM) {
      KJ_FAIL_SYSCALL("getaddrinfo", errno, params.host, params.service) {
        return;
      }
    } else {
      KJ_FAIL_REQUIRE("DNS lookup failed.",
                      params.host, params.service, gai_strerror(status)) {
        return;
      }
    }
  }));

  auto reader = heap<LookupReader>(kj::mv(thread), kj::mv(input), filter);
  return reader->read().attach(kj::mv(reader));
}